

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineDepthTests.cpp
# Opt level: O2

TestStatus *
vkt::pipeline::anon_unknown_0::testSupportsDepthStencilFormat
          (TestStatus *__return_storage_ptr__,Context *context,VkFormat format)

{
  bool bVar1;
  InstanceInterface *instanceInterface;
  VkPhysicalDevice device;
  allocator<char> local_41;
  string local_40;
  
  instanceInterface = Context::getInstanceInterface(context);
  device = Context::getPhysicalDevice(context);
  bVar1 = isSupportedDepthStencilFormat(instanceInterface,device,format);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Format can be used in depth/stencil attachment",&local_41);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_40);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Unsupported depth/stencil attachment format",&local_41);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_40);
  }
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus testSupportsDepthStencilFormat (Context& context, VkFormat format)
{
	DE_ASSERT(vk::isDepthStencilFormat(format));

	if (isSupportedDepthStencilFormat(context.getInstanceInterface(), context.getPhysicalDevice(), format))
		return tcu::TestStatus::pass("Format can be used in depth/stencil attachment");
	else
		return tcu::TestStatus::fail("Unsupported depth/stencil attachment format");
}